

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O2

void ecs_workers_progress(ecs_world_t *world)

{
  ecs_entity_t pipeline;
  int32_t iVar1;
  int iVar2;
  int iVar3;
  ecs_entity_t scope;
  int32_t sync_count;
  int iVar4;
  double dVar5;
  ecs_time_t start;
  
  pipeline = world->pipeline;
  iVar1 = ecs_vector_count(world->workers);
  start.sec = 0;
  start.nanosec = 0;
  if (world->measure_frame_time == true) {
    ecs_time_measure(&start);
  }
  iVar2 = ecs_pipeline_begin(world,pipeline);
  if (iVar1 < 2) {
    scope = ecs_set_scope(world,0);
    ecs_pipeline_progress(world,pipeline,(world->stats).delta_time);
    ecs_set_scope(world,scope);
  }
  else {
    iVar1 = ecs_vector_count(world->workers);
    do {
      (*ecs_os_api.mutex_lock_)(world->sync_mutex);
      iVar4 = world->workers_running;
      (*ecs_os_api.mutex_unlock_)(world->sync_mutex);
    } while (iVar4 != iVar1);
    for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
      ecs_staging_begin(world);
      world->workers_waiting = 0;
      signal_workers(world);
      iVar1 = ecs_vector_count(world->workers);
      (*ecs_os_api.mutex_lock_)(world->sync_mutex);
      iVar3 = iVar1;
      if (world->workers_waiting != iVar1) {
        (*ecs_os_api.cond_wait_)(world->sync_cond,world->sync_mutex);
        iVar3 = world->workers_waiting;
      }
      _ecs_assert(iVar3 == iVar1,0xc,(char *)0x0,"world->workers_waiting == thread_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/worker.c"
                  ,0x79);
      if (world->workers_waiting != iVar1) {
        __assert_fail("world->workers_waiting == thread_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/worker.c"
                      ,0x79,"void wait_for_sync(ecs_world_t *)");
      }
      (*ecs_os_api.mutex_unlock_)(world->sync_mutex);
      ecs_staging_end(world);
      iVar1 = ecs_pipeline_update(world,pipeline);
      if (iVar1 != 0) {
        iVar2 = iVar1;
      }
    }
  }
  ecs_pipeline_end(world);
  if (world->measure_frame_time == true) {
    dVar5 = ecs_time_measure(&start);
    (world->stats).system_time_total = (float)dVar5 + (world->stats).system_time_total;
  }
  return;
}

Assistant:

void ecs_workers_progress(
    ecs_world_t *world)
{
    ecs_entity_t pipeline = world->pipeline;
    int32_t thread_count = ecs_vector_count(world->workers);

    ecs_time_t start = {0};
    if (world->measure_frame_time) {
        ecs_time_measure(&start);
    }

    if (thread_count <= 1) {
        ecs_pipeline_begin(world, pipeline);
        ecs_entity_t old_scope = ecs_set_scope(world, 0);
        ecs_pipeline_progress(world, pipeline, world->stats.delta_time);
        ecs_set_scope(world, old_scope);
        ecs_pipeline_end(world);
    } else {
        int32_t i, sync_count = ecs_pipeline_begin(world, pipeline);

        /* Make sure workers are running and ready */
        wait_for_workers(world);

        /* Synchronize n times for each op in the pipeline */
        for (i = 0; i < sync_count; i ++) {
            ecs_staging_begin(world);

            /* Signal workers that they should start running systems */
            world->workers_waiting = 0;
            signal_workers(world);

            /* Wait until all workers are waiting on sync point */
            wait_for_sync(world);

            /* Merge */
            ecs_staging_end(world);

            int32_t update_count;
            if ((update_count = ecs_pipeline_update(world, pipeline))) {
                /* The number of operations in the pipeline could have changed
                 * as result of the merge */
                sync_count = update_count;
            }
        }

        ecs_pipeline_end(world);
    }

    if (world->measure_frame_time) {
        world->stats.system_time_total += (FLECS_FLOAT)ecs_time_measure(&start);
    }    
}